

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prscomp.c
# Opt level: O0

void prssyn(prscxdef *ctx,objnum objn,uchar *prefix,uchar *synto,uchar *synfrom)

{
  char *in_RDX;
  uchar buf [2];
  prpnum propfrom;
  prpnum propto;
  size_t plen;
  uchar *in_stack_00000078;
  size_t in_stack_00000080;
  uchar *in_stack_00000088;
  prscxdef *in_stack_00000090;
  objucxdef *in_stack_00000188;
  void *in_stack_00000190;
  dattyp in_stack_00000198;
  prpnum in_stack_0000019c;
  objnum in_stack_0000019e;
  mcmcxdef *in_stack_000001a0;
  undefined1 local_36 [2];
  prpnum local_34;
  ushort local_32;
  size_t local_30;
  
  local_30 = strlen(in_RDX);
  local_32 = prssynp(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078);
  local_34 = prssynp(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078);
  oswp2(local_36,(uint)local_32);
  objsetp(in_stack_000001a0,in_stack_0000019e,in_stack_0000019c,in_stack_00000198,in_stack_00000190,
          in_stack_00000188);
  return;
}

Assistant:

static void prssyn(prscxdef *ctx, objnum objn, uchar *prefix,
                   uchar *synto, uchar *synfrom)
{
    size_t   plen = strlen((char *)prefix);
    prpnum   propto;
    prpnum   propfrom;
    uchar    buf[2];

    /* get the property numbers for the 'to' and 'from' strings */
    propto = prssynp(ctx, prefix, plen, synto);
    propfrom = prssynp(ctx, prefix, plen, synfrom);

    /* set the synonym property */
    oswp2(buf, propto);
    objsetp(ctx->prscxmem, (mcmon)objn, propfrom, DAT_SYN, buf,
            (objucxdef *)0);
}